

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O3

c_v64 c_v64_shr_u8(c_v64 a,uint n)

{
  undefined1 auVar1 [32];
  c_v64 cVar2;
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [16];
  
  auVar3 = in_ZMM0._0_16_;
  if (7 < n) {
    c_v64_shr_u8();
    cVar2._0_4_ = 0xff >> ((byte)n & 0x1f);
    cVar2.u32[1] = 0;
    auVar4[0] = (undefined1)cVar2._0_4_;
    auVar4[1] = auVar4[0];
    auVar4[2] = auVar4[0];
    auVar4[3] = auVar4[0];
    auVar4[4] = auVar4[0];
    auVar4[5] = auVar4[0];
    auVar4[6] = auVar4[0];
    auVar4[7] = auVar4[0];
    auVar4[8] = auVar4[0];
    auVar4[9] = auVar4[0];
    auVar4[10] = auVar4[0];
    auVar4[0xb] = auVar4[0];
    auVar4[0xc] = auVar4[0];
    auVar4[0xd] = auVar4[0];
    auVar4[0xe] = auVar4[0];
    auVar4[0xf] = auVar4[0];
    auVar3 = vpsrlw_avx(auVar3,ZEXT416(n));
    vpand_avx(auVar3,auVar4);
    return (c_v64)cVar2.u64;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = a.u64;
  auVar1 = vpmovzxbd_avx2(auVar3);
  auVar1 = vpsrld_avx2(auVar1,ZEXT416(n));
  auVar3 = vpackusdw_avx(auVar1._0_16_,auVar1._16_16_);
  auVar3 = vpackuswb_avx(auVar3,auVar3);
  return (c_v64)auVar3._0_8_;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shr_u8(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 7) {
    fprintf(stderr, "Error: Undefined u8 shift right %d\n", n);
    abort();
  }
  for (c = 0; c < 8; c++) t.u8[c] = a.u8[c] >> n;
  return t;
}